

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BEREncode.cpp
# Opt level: O3

int __thiscall ComplexType::serialise(ComplexType *this,uint8_t *buf,size_t max_len)

{
  uint8_t *puVar1;
  pointer psVar2;
  element_type *peVar3;
  ulong uVar4;
  uint uVar5;
  uint8_t uVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  pointer psVar11;
  uint8_t *puVar12;
  
  if (max_len < 2) {
    return -0x1f;
  }
  *buf = (char)(this->super_BER_CONTAINER)._type;
  puVar1 = buf + 2;
  psVar2 = (this->values).
           super__Vector_base<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar9 = 0;
  puVar12 = puVar1;
  for (psVar11 = (this->values).
                 super__Vector_base<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar11 != psVar2; psVar11 = psVar11 + 1
      ) {
    peVar3 = (psVar11->super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (peVar3 == (element_type *)0x0) {
      return -0x20;
    }
    uVar5 = (*peVar3->_vptr_BER_CONTAINER[2])(peVar3,puVar12,(long)(int)~uVar9 + max_len);
    if ((int)uVar5 < 0) {
      return uVar5;
    }
    uVar9 = uVar9 + uVar5;
    puVar12 = puVar12 + uVar5;
  }
  lVar8 = 1;
  if (0x7f < uVar9) {
    lVar8 = 3 - (ulong)(uVar9 < 0x101);
  }
  if (max_len < (ulong)uVar9 + lVar8 + 1) {
    return -0x1f;
  }
  iVar7 = 2;
  puVar12 = buf + 1;
  if (uVar9 < 0x80) goto LAB_00106ce6;
  if ((int)(uVar9 - 1) < 0) {
LAB_00106cbf:
    buf[2] = (uint8_t)(uVar9 >> 8);
    iVar7 = 4;
    uVar6 = 0x82;
    puVar12 = buf + 3;
  }
  else {
    iVar7 = (int)lVar8 + uVar9 + -2;
    uVar4 = (ulong)(uVar9 - 1);
    do {
      uVar10 = uVar4 - 1;
      puVar1[iVar7] = buf[uVar4 + 2];
      iVar7 = iVar7 + -1;
      uVar4 = uVar10;
    } while (-1 < (int)uVar10);
    if (0x100 < uVar9) goto LAB_00106cbf;
    iVar7 = 3;
    uVar6 = 0x81;
    puVar12 = puVar1;
  }
  buf[1] = uVar6;
LAB_00106ce6:
  *puVar12 = (uint8_t)uVar9;
  return iVar7 + uVar9;
}

Assistant:

int ComplexType::serialise(uint8_t* buf, size_t max_len){
    int i = BER_CONTAINER::serialise(buf, max_len);
    CHECK_ENCODE_ERR(i);

    uint8_t* ptr = buf + i;
    uint8_t* len_ptr = ptr++;

    uint8_t* internalPtr = ptr; // This is V*

    int internalLength = 0;

    for(const auto& item : values){
        if(!item) return SNMP_BUFFER_ENCODE_ERROR_INVALID_ITEM;
        int length = item->serialise(internalPtr, max_len - internalLength - 1);
        if(length < 0){
            SNMP_LOGD("Item failed to serialiseInto: %d, reason: %d\n", item->_type, length);
            CHECK_ENCODE_ERR(length);
        }
        internalPtr += length;
        internalLength += length;
    }

    int num_length_bytes = encode_ber_length_integer_count(internalLength);
    if(max_len < (size_t)i + internalLength + num_length_bytes) return SNMP_BUFFER_ENCODE_ERR_LEN_EXCEEDED;
    if(num_length_bytes > 1){
        shift_arr_right(ptr, num_length_bytes-1, internalLength);
    }

    // then write the length value
    i += encode_ber_length_integer(len_ptr, internalLength, num_length_bytes); // , max_len_bytes just to be safe
    return internalLength + i;
}